

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Vec_t * Abc_NtkLevelize(Abc_Ntk_t *pNtk)

{
  void *Entry;
  uint uVar1;
  Vec_Vec_t *p;
  void **ppvVar2;
  undefined8 *puVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar1 = Abc_NtkLevel(pNtk);
  uVar7 = uVar1 + 1;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar1) {
    uVar5 = uVar7;
  }
  p->nSize = 0;
  p->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)(int)uVar5 << 3);
  }
  p->pArray = ppvVar2;
  if (-1 < (int)uVar1) {
    uVar6 = 0;
    do {
      puVar3 = (undefined8 *)malloc(0x10);
      *puVar3 = 0;
      puVar3[1] = 0;
      ppvVar2[uVar6] = puVar3;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  p->nSize = uVar7;
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      Entry = pVVar4->pArray[lVar8];
      if ((Entry != (void *)0x0) && ((*(uint *)((long)Entry + 0x14) & 0xf) == 7)) {
        uVar7 = *(uint *)((long)Entry + 0x14) >> 0xc;
        if ((int)uVar1 < (int)uVar7) {
          __assert_fail("(int)pObj->Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x598,"Vec_Vec_t *Abc_NtkLevelize(Abc_Ntk_t *)");
        }
        Vec_VecPush(p,uVar7,Entry);
      }
      lVar8 = lVar8 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar8 < pVVar4->nSize);
  }
  return p;
}

Assistant:

Vec_Vec_t * Abc_NtkLevelize( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Abc_NtkLevel( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}